

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.c
# Opt level: O0

char * duckdb_shell_sqlite3_vmprintf(char *zFormat,__va_list_tag *ap)

{
  char *pcVar1;
  StrAccum acc;
  char zBase [70];
  char *z;
  __va_list_tag *in_stack_00000280;
  char *in_stack_00000288;
  StrAccum *in_stack_00000290;
  StrAccum *in_stack_ffffffffffffff78;
  char local_68 [104];
  
  duckdb_shell_sqlite3StrAccumInit
            ((StrAccum *)&stack0xffffffffffffff78,(void *)0x0,local_68,0x46,1000000000);
  duckdb_shell_sqlite3VXPrintf(in_stack_00000290,in_stack_00000288,in_stack_00000280);
  pcVar1 = duckdb_shell_sqlite3StrAccumFinish(in_stack_ffffffffffffff78);
  return pcVar1;
}

Assistant:

char *sqlite3_vmprintf(const char *zFormat, va_list ap) {
	char *z;
	char zBase[SQLITE_PRINT_BUF_SIZE];
	StrAccum acc;

	sqlite3StrAccumInit(&acc, 0, zBase, sizeof(zBase), SQLITE_MAX_LENGTH);
	sqlite3VXPrintf(&acc, zFormat, ap);
	z = sqlite3StrAccumFinish(&acc);
	return z;
}